

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# content_encoding.c
# Opt level: O0

void Curl_all_content_encodings(char *buf,size_t blen)

{
  int iVar1;
  size_t sVar2;
  char *pcVar3;
  char *local_38;
  char *p;
  Curl_cwtype *ce;
  Curl_cwtype **cep;
  size_t len;
  size_t blen_local;
  char *buf_local;
  
  cep = (Curl_cwtype **)0x0;
  *buf = '\0';
  for (ce = (Curl_cwtype *)general_unencoders; ce->name != (char *)0x0;
      ce = (Curl_cwtype *)&ce->alias) {
    pcVar3 = ce->name;
    iVar1 = curl_strequal(*(char **)pcVar3,"identity");
    if (iVar1 == 0) {
      sVar2 = strlen(*(char **)pcVar3);
      cep = (Curl_cwtype **)(sVar2 + 2 + (long)cep);
    }
  }
  if (cep == (Curl_cwtype **)0x0) {
    if (8 < blen) {
      strcpy(buf,"identity");
    }
  }
  else if (cep < blen) {
    local_38 = buf;
    for (ce = (Curl_cwtype *)general_unencoders; ce->name != (char *)0x0;
        ce = (Curl_cwtype *)&ce->alias) {
      pcVar3 = ce->name;
      iVar1 = curl_strequal(*(char **)pcVar3,"identity");
      if (iVar1 == 0) {
        strcpy(local_38,*(char **)pcVar3);
        sVar2 = strlen(local_38);
        pcVar3 = local_38 + sVar2;
        *pcVar3 = ',';
        local_38 = pcVar3 + 2;
        pcVar3[1] = ' ';
      }
    }
    local_38[-2] = '\0';
  }
  return;
}

Assistant:

void Curl_all_content_encodings(char *buf, size_t blen)
{
  size_t len = 0;
  const struct Curl_cwtype * const *cep;
  const struct Curl_cwtype *ce;

  DEBUGASSERT(buf);
  DEBUGASSERT(blen);
  buf[0] = 0;

  for(cep = general_unencoders; *cep; cep++) {
    ce = *cep;
    if(!strcasecompare(ce->name, CONTENT_ENCODING_DEFAULT))
      len += strlen(ce->name) + 2;
  }

  if(!len) {
    if(blen >= sizeof(CONTENT_ENCODING_DEFAULT))
      strcpy(buf, CONTENT_ENCODING_DEFAULT);
  }
  else if(blen > len) {
    char *p = buf;
    for(cep = general_unencoders; *cep; cep++) {
      ce = *cep;
      if(!strcasecompare(ce->name, CONTENT_ENCODING_DEFAULT)) {
        strcpy(p, ce->name);
        p += strlen(p);
        *p++ = ',';
        *p++ = ' ';
      }
    }
    p[-2] = '\0';
  }
}